

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_xar_empty.c
# Opt level: O2

void test_write_format_xar_empty(void)

{
  int iVar1;
  archive *_a;
  archive_entry *paVar2;
  char *e1;
  wchar_t line;
  longlong v2;
  char *e2;
  size_t used;
  char buff [256];
  
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                   ,L')',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_xar(_a);
  if (iVar1 == 0) {
    iVar1 = archive_write_add_filter_none(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",_a);
    iVar1 = archive_write_set_bytes_per_block(_a,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 1)",
                        _a);
    iVar1 = archive_write_set_bytes_in_last_block(_a,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_bytes_in_last_block(a, 1)",_a);
    iVar1 = archive_write_open_memory(_a,buff,0x100,&used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'3',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",_a);
    paVar2 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                     ,L'6',(uint)(paVar2 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname(paVar2,".");
    archive_entry_set_mode(paVar2,0x41ed);
    iVar1 = archive_write_header(_a,paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar2);
    paVar2 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                     ,L'@',(uint)(paVar2 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname(paVar2,"..");
    archive_entry_set_mode(paVar2,0x41ed);
    iVar1 = archive_write_header(_a,paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar2);
    paVar2 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                     ,L'J',(uint)(paVar2 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname(paVar2,"/");
    archive_entry_set_mode(paVar2,0x41ed);
    iVar1 = archive_write_header(_a,paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'P',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar2);
    paVar2 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                     ,L'T',(uint)(paVar2 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname(paVar2,"../");
    archive_entry_set_mode(paVar2,0x41ed);
    iVar1 = archive_write_header(_a,paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'Z',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar2);
    paVar2 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                     ,L'^',(uint)(paVar2 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname(paVar2,"../../.");
    archive_entry_set_mode(paVar2,0x41ed);
    iVar1 = archive_write_header(_a,paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'd',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar2);
    paVar2 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                     ,L'h',(uint)(paVar2 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname(paVar2,"..//.././");
    archive_entry_set_mode(paVar2,0x41ed);
    iVar1 = archive_write_header(_a,paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'n',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar2);
    iVar1 = archive_write_close(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",_a);
    iVar1 = archive_write_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                        ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    _a = (archive *)0x0;
    e1 = "used";
    e2 = "0";
    line = L'v';
    v2 = 0;
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                   ,L'+');
    test_skipping("xar is not supported on this platform");
    iVar1 = archive_write_free(_a);
    v2 = (longlong)iVar1;
    e1 = "ARCHIVE_OK";
    e2 = "archive_write_free(a)";
    line = L',';
    used = 0;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                      ,line,used,e1,v2,e2,_a);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_xar_empty)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[256];
	size_t used;

	/* Xar format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	if (archive_write_set_format_xar(a) != ARCHIVE_OK) {
		skipping("xar is not supported on this platform");
		assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Add "." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, ".");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add ".." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "..");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "/" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "/");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "../" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "../");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "../../." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "../../.");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "..//.././" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "..//.././");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive without writing anything. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the correct format for an empty Xar archive. */
	assertEqualInt(used, 0);
}